

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_parameters.h
# Opt level: O3

void __thiscall sparse_parameters::stride_shift(sparse_parameters *this,uint32_t stride_shift)

{
  float *pfVar1;
  
  this->_stride_shift = stride_shift;
  free(this->default_value);
  pfVar1 = calloc_or_throw<float>(1L << ((byte)this->_stride_shift & 0x3f));
  this->default_value = pfVar1;
  if (this->fun != (_func_void_weight_ptr_void_ptr *)0x0) {
    (*this->fun)(pfVar1,this->default_data);
    return;
  }
  return;
}

Assistant:

void stride_shift(uint32_t stride_shift)
  {
    _stride_shift = stride_shift;
    free(default_value);
    default_value = calloc_mergable_or_throw<weight>(stride());
    if (fun != nullptr)
      fun(default_value, default_data);
  }